

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O0

vm_globalvar_t * __thiscall CVmObjTable::create_global_var(CVmObjTable *this)

{
  vm_globalvar_t *this_00;
  long in_RDI;
  vm_globalvar_t *var;
  
  this_00 = (vm_globalvar_t *)operator_new(0x20);
  memset(this_00,0,0x20);
  vm_val_t::set_nil((vm_val_t *)this_00);
  this_00->nxt = *(vm_globalvar_t **)(in_RDI + 0x10);
  this_00->prv = (vm_globalvar_t *)0x0;
  if (*(long *)(in_RDI + 0x10) != 0) {
    *(vm_globalvar_t **)(*(long *)(in_RDI + 0x10) + 0x18) = this_00;
  }
  *(vm_globalvar_t **)(in_RDI + 0x10) = this_00;
  return this_00;
}

Assistant:

vm_globalvar_t *CVmObjTable::create_global_var()
{
    vm_globalvar_t *var;

    /* create the new variable */
    var = new vm_globalvar_t();

    /* initialize the variable's value to nil */
    var->val.set_nil();

    /* link it into our list of globals */
    var->nxt = global_var_head_;
    var->prv = 0;
    if (global_var_head_ != 0)
        global_var_head_->prv = var;
    global_var_head_ = var;

    /* return the variable */
    return var;
}